

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndp.cpp
# Opt level: O1

void __thiscall libDAI::NDP::ComputeHeuristicVariableOrdering(NDP *this)

{
  pointer puVar1;
  pointer __first;
  pointer __last;
  int iVar2;
  undefined4 extraout_var;
  vector<libDAI::Var,_std::allocator<libDAI::Var>_> *__x;
  _Iter_comp_iter<libDAI::NDP::VariableHasLowerDegree> __comp;
  undefined4 extraout_var_01;
  unsigned_long uVar3;
  ostream *poVar4;
  ulong uVar5;
  long lVar6;
  vector<libDAI::Var,_std::allocator<libDAI::Var>_> v;
  vector<libDAI::Var,_std::allocator<libDAI::Var>_> local_38;
  undefined4 extraout_var_00;
  
  iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])();
  __x = (vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)
        (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x38))
                  ((long *)CONCAT44(extraout_var,iVar2));
  std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::vector(&local_38,__x);
  __comp._M_comp._m_grm._0_4_ =
       (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
  __last = local_38.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __first = local_38.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
            super__Vector_impl_data._M_start;
  __comp._M_comp._m_grm._4_4_ = extraout_var_00;
  if (local_38.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_38.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<libDAI::Var*,std::vector<libDAI::Var,std::allocator<libDAI::Var>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<libDAI::NDP::VariableHasLowerDegree>>
              ((__normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                )local_38.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                )local_38.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                 super__Vector_impl_data._M_finish,
               (ulong)(uint)((int)LZCOUNT((long)local_38.
                                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)local_38.
                                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 4) * 2)
               ^ 0x7e,__comp);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<libDAI::Var*,std::vector<libDAI::Var,std::allocator<libDAI::Var>>>,__gnu_cxx::__ops::_Iter_comp_iter<libDAI::NDP::VariableHasLowerDegree>>
              ((__normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                )__first,
               (__normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                )__last,__comp);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->_m_varOrder,
             (long)local_38.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_38.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                   super__Vector_impl_data._M_start >> 4);
  if (local_38.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_38.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar6 = 0;
    uVar5 = 0;
    do {
      iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      if ((ulong)((long)local_38.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_38.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 4) <= uVar5) {
LAB_004e3851:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar5
                  );
      }
      uVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x40))
                        ((long *)CONCAT44(extraout_var_01,iVar2),
                         (long)&(local_38.
                                 super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                 _M_impl.super__Vector_impl_data._M_start)->_label + lVar6);
      puVar1 = (this->_m_varOrder).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->_m_varOrder).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar1 >> 3) <= uVar5)
      goto LAB_004e3851;
      puVar1[uVar5] = uVar3;
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x10;
    } while (uVar5 < (ulong)((long)local_38.
                                   super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_38.
                                   super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 4));
  }
  if (3 < (this->Props).verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"variable ordering computed:\n[",0x1d);
    if (local_38.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_38.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar5 = 0;
      do {
        if ((ulong)((long)(this->_m_varOrder).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(this->_m_varOrder).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3) <= uVar5) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar5);
        }
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
        uVar5 = uVar5 + 1;
      } while (uVar5 < (ulong)((long)local_38.
                                     super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)local_38.
                                     super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 4));
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"]",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
  }
  if (local_38.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_start != (Var *)0x0) {
    operator_delete(local_38.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void NDP::ComputeHeuristicVariableOrdering()
    {
        //NDPMemFn vhld = &NDP::VariableHasLowerDegree;
        std::vector< Var > v = grm().vars();
        //variable with lower degrees first:
        VariableHasLowerDegree vhld(grm());
        std::sort(v.begin(), v.end(), vhld);

        _m_varOrder.resize( v.size() );
        for(size_t i=0; i<v.size(); i++)
        {
            size_t varI = grm().findVar( v.at(i) );
            _m_varOrder.at(i) = varI;
        }

        if( Props.verbose > 3)
        {
            cout << "variable ordering computed:\n[";
            for(size_t i=0; i<v.size(); i++)
                cout <<  _m_varOrder.at(i) << ", ";
            cout << "]"<<endl;
        }

    }